

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O2

void __thiscall rtosc::ThreadLink::~ThreadLink(ThreadLink *this)

{
  internal_ringbuffer_t *piVar1;
  
  piVar1 = this->ring;
  if (piVar1->buffer != (char *)0x0) {
    operator_delete__(piVar1->buffer);
    piVar1 = this->ring;
  }
  operator_delete(piVar1,0x28);
  if (this->write_buffer != (char *)0x0) {
    operator_delete__(this->write_buffer);
  }
  if (this->read_buffer != (char *)0x0) {
    operator_delete__(this->read_buffer);
    return;
  }
  return;
}

Assistant:

ThreadLink::~ThreadLink(void)
{
    delete[] ring->buffer;
    delete   ring;
    delete[] write_buffer;
    delete[] read_buffer;
}